

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O1

void __thiscall
github111116::ConsoleLogger::error<char[6],int,char[39]>
          (ConsoleLogger *this,char (*args) [6],int *args_1,char (*args_2) [39])

{
  int iVar1;
  
  if (3 < this->loglevel) {
    return;
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar1 == 0) {
    if (this->colored == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                (this->out,(this->errorColor)._M_dataplus._M_p,(this->errorColor)._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->out,"[X] ",4);
    print<char[6],int,char[39]>(this,args,args_1,args_2);
    if (this->colored == true) {
      std::__ostream_insert<char,std::char_traits<char>>(this->out,"\x1b[0m",4);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void ConsoleLogger::error(const Args&... args)
{
	if (loglevel > 3) return;
	mtx.lock();
	if (colored) out << errorColor;
	out << "[X] ";
	print(args...);
	if (colored) out << "\033[0m";
	mtx.unlock();
}